

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::MemoryType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
          *values,MemoryType *out,char *desc)

{
  pointer pMVar1;
  pointer pMVar2;
  Result RVar3;
  uint64_t local_98;
  uint64_t uStack_90;
  undefined8 local_88;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar3 = CheckIndex(this,&local_78,
                     (int)((ulong)((long)(values->
                                         super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(values->
                                        super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555,desc);
  Var::~Var(&local_78);
  if (out != (MemoryType *)0x0) {
    if (RVar3.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.h"
                      ,0x38,"Index wabt::Var::index() const");
      }
      pMVar1 = (values->
               super__Vector_base<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pMVar2 = pMVar1 + (var->field_2).index_;
      local_88._0_1_ = (pMVar2->limits).has_max;
      local_88._1_1_ = (pMVar2->limits).is_shared;
      local_88._2_1_ = (pMVar2->limits).is_64;
      local_88._3_5_ = *(undefined5 *)&(pMVar2->limits).field_0x13;
      pMVar1 = pMVar1 + (var->field_2).index_;
      local_98 = (pMVar1->limits).initial;
      uStack_90 = (pMVar1->limits).max;
    }
    else {
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
    }
    (out->limits).has_max = (bool)(undefined1)local_88;
    (out->limits).is_shared = (bool)local_88._1_1_;
    (out->limits).is_64 = (bool)local_88._2_1_;
    *(undefined5 *)&(out->limits).field_0x13 = local_88._3_5_;
    (out->limits).initial = local_98;
    (out->limits).max = uStack_90;
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}